

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

SmallVectorImpl<llvm::DWARFDebugLoc::Entry> * __thiscall
llvm::SmallVectorImpl<llvm::DWARFDebugLoc::Entry>::operator=
          (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *this,
          SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *RHS)

{
  uint uVar1;
  uint uVar2;
  SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *__ptr;
  undefined8 uVar3;
  ulong uVar4;
  void *pvVar5;
  uint *puVar6;
  long lVar7;
  undefined8 *puVar8;
  undefined8 *puVar9;
  long lVar10;
  
  if (this != RHS) {
    puVar6 = (uint *)(RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                     super_SmallVectorBase.BeginX;
    if ((SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *)puVar6 == RHS + 1) {
      uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.Size;
      uVar2 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.Size;
      uVar4 = (ulong)uVar2;
      if (uVar2 < uVar1) {
        if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
            Capacity < uVar1) {
          if (uVar4 != 0) {
            pvVar5 = (void *)((long)(this->
                                    super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>
                                    ).
                                    super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>
                                    .super_SmallVectorBase.BeginX + uVar4 * 0x28 + -8);
            lVar7 = uVar4 * -0x28;
            do {
              if (pvVar5 != *(void **)((long)pvVar5 + -0x10)) {
                free(*(void **)((long)pvVar5 + -0x10));
              }
              pvVar5 = (void *)((long)pvVar5 + -0x28);
              lVar7 = lVar7 + 0x28;
            } while (lVar7 != 0);
          }
          (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
          super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
          Size = 0;
          SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>::grow
                    (&this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>,
                     (ulong)uVar1);
          uVar4 = 0;
        }
        else if (uVar4 == 0) {
          uVar4 = 0;
        }
        else {
          pvVar5 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                   super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                   super_SmallVectorBase.BeginX;
          lVar7 = uVar4 + 1;
          lVar10 = 0;
          do {
            puVar8 = (undefined8 *)((long)puVar6 + lVar10);
            uVar3 = puVar8[1];
            puVar9 = (undefined8 *)((long)pvVar5 + lVar10);
            *puVar9 = *puVar8;
            puVar9[1] = uVar3;
            SmallVectorImpl<unsigned_char>::operator=
                      ((SmallVectorImpl<unsigned_char> *)(puVar9 + 2),
                       (SmallVectorImpl<unsigned_char> *)(puVar8 + 2));
            lVar7 = lVar7 + -1;
            lVar10 = lVar10 + 0x28;
          } while (1 < lVar7);
        }
        pvVar5 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.BeginX;
        std::__uninitialized_copy<false>::
        __uninit_copy<std::move_iterator<llvm::DWARFDebugLoc::Entry*>,llvm::DWARFDebugLoc::Entry*>
                  ((Entry *)((long)pvVar5 + uVar4 * 0x28),
                   (Entry *)((long)pvVar5 +
                            (ulong)(RHS->
                                   super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>)
                                   .
                                   super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>
                                   .super_SmallVectorBase.Size * 0x28),
                   (Entry *)(uVar4 * 0x28 +
                            (long)(this->
                                  super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                                  super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                                  super_SmallVectorBase.BeginX));
        if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
            Capacity < uVar1) {
LAB_00d81b4e:
          __assert_fail("N <= capacity()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                        ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
        }
        (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
        super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size
             = uVar1;
      }
      else {
        puVar8 = (undefined8 *)
                 (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.BeginX;
        if (uVar1 != 0) {
          lVar7 = (ulong)uVar1 + 1;
          do {
            uVar3 = *(undefined8 *)(puVar6 + 2);
            *puVar8 = *(undefined8 *)puVar6;
            puVar8[1] = uVar3;
            SmallVectorImpl<unsigned_char>::operator=
                      ((SmallVectorImpl<unsigned_char> *)(puVar8 + 2),
                       (SmallVectorImpl<unsigned_char> *)(puVar6 + 4));
            puVar8 = puVar8 + 5;
            lVar7 = lVar7 + -1;
            puVar6 = puVar6 + 10;
          } while (1 < lVar7);
        }
        pvVar5 = (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                 super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                 super_SmallVectorBase.BeginX;
        uVar4 = (ulong)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                       super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                       super_SmallVectorBase.Size;
        if ((undefined8 *)((long)pvVar5 + uVar4 * 0x28) != puVar8) {
          pvVar5 = (void *)((long)pvVar5 + uVar4 * 0x28 + -8);
          do {
            if (pvVar5 != *(void **)((long)pvVar5 + -0x10)) {
              free(*(void **)((long)pvVar5 + -0x10));
            }
            puVar9 = (undefined8 *)((long)pvVar5 + -0x20);
            pvVar5 = (void *)((long)pvVar5 + -0x28);
          } while (puVar9 != puVar8);
        }
        if ((this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
            super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
            Capacity < uVar1) goto LAB_00d81b4e;
        (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
        super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size
             = uVar1;
      }
      clear(RHS);
    }
    else {
      uVar4 = (ulong)(this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                     super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                     super_SmallVectorBase.Size;
      if (uVar4 != 0) {
        pvVar5 = (void *)((long)(this->
                                super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
                                super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
                                super_SmallVectorBase.BeginX + uVar4 * 0x28 + -8);
        lVar7 = uVar4 * -0x28;
        do {
          if (pvVar5 != *(void **)((long)pvVar5 + -0x10)) {
            free(*(void **)((long)pvVar5 + -0x10));
          }
          pvVar5 = (void *)((long)pvVar5 + -0x28);
          lVar7 = lVar7 + 0x28;
        } while (lVar7 != 0);
      }
      __ptr = (SmallVectorImpl<llvm::DWARFDebugLoc::Entry> *)
              (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.BeginX;
      if (__ptr != this + 1) {
        free(__ptr);
      }
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX
           = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
             super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase
             .BeginX;
      uVar1 = (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
              super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.
              super_SmallVectorBase.Capacity;
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size =
           (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
           super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
           Size;
      (this->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
      Capacity = uVar1;
      (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.BeginX
           = RHS + 1;
      (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.Size =
           0;
      (RHS->super_SmallVectorTemplateBase<llvm::DWARFDebugLoc::Entry,_false>).
      super_SmallVectorTemplateCommon<llvm::DWARFDebugLoc::Entry,_void>.super_SmallVectorBase.
      Capacity = 0;
    }
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::operator=(SmallVectorImpl<T> &&RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If the RHS isn't small, clear this vector and then steal its buffer.
  if (!RHS.isSmall()) {
    this->destroy_range(this->begin(), this->end());
    if (!this->isSmall()) free(this->begin());
    this->BeginX = RHS.BeginX;
    this->Size = RHS.Size;
    this->Capacity = RHS.Capacity;
    RHS.resetToSmall();
    return *this;
  }

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd = this->begin();
    if (RHSSize)
      NewEnd = std::move(RHS.begin(), RHS.end(), NewEnd);

    // Destroy excess elements and trim the bounds.
    this->destroy_range(NewEnd, this->end());
    this->set_size(RHSSize);

    // Clear the RHS.
    RHS.clear();

    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: this may not actually make any sense if we can efficiently move
  // elements.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->set_size(0);
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::move(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Move-construct the new elements in place.
  this->uninitialized_move(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->set_size(RHSSize);

  RHS.clear();
  return *this;
}